

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# czsurface.c
# Opt level: O0

czsurface_blit_status czsurface_blit(czsurface *src,czsurface *dst,czpoint dstpoint)

{
  czsurface *dst_local;
  czsurface *src_local;
  czpoint dstpoint_local;
  
  czsurface_internal_blit(src,dst,dstpoint);
  return CZSURFACE_BLIT_OK;
}

Assistant:

czsurface_blit_status czsurface_blit(czsurface * src, czsurface * dst, czpoint dstpoint) {
    czsurface_internal_blit(src, dst, dstpoint);
    return CZSURFACE_BLIT_OK;
}